

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,1,2,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  pair<unsigned_long,_unsigned_long> *ppVar2;
  void *pvVar3;
  pointer puVar4;
  unsigned_long *puVar5;
  _Map_pointer pppVar6;
  _Map_pointer pppVar7;
  comm *comm_00;
  unsigned_long uVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  comm *pcVar11;
  _Elt_pointer ppVar12;
  pair<unsigned_long,_unsigned_long> *ppVar13;
  _Elt_pointer ppVar14;
  unsigned_long uVar15;
  _Elt_pointer ppVar16;
  ulong uVar17;
  size_type sVar18;
  int iVar19;
  int iVar20;
  _Elt_pointer ppVar21;
  long lVar22;
  _Elt_pointer ppVar23;
  long lVar24;
  pointer puVar25;
  ulong uVar26;
  ulong uVar27;
  _Elt_pointer ppVar28;
  long lVar29;
  ulong uVar30;
  ulong *puVar31;
  unsigned_long uVar32;
  unsigned_long uVar33;
  _Elt_pointer ppVar34;
  bool bVar35;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  pointer local_1e0;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1d8;
  _Elt_pointer local_180;
  _Elt_pointer local_178;
  _Elt_pointer local_170;
  comm *local_168;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_160;
  _Elt_pointer local_158;
  _Elt_pointer local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Elt_pointer local_130;
  size_type local_128;
  pair<unsigned_long,_unsigned_long> local_120;
  pointer local_110;
  pointer local_108;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_100;
  size_type local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Elt_pointer local_80;
  unsigned_long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_180 = (_Elt_pointer)left_nsv;
  local_160 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_110 = (pointer)nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1d8,0);
  local_e8 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  uVar8 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_e8,comm);
  lVar29 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar29 != 0) {
    lVar29 = lVar29 >> 3;
    local_178 = (_Elt_pointer)(uVar8 - 1);
LAB_0013661d:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar29 + -1] < ppVar10[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013661d;
        }
      }
      while (lVar22 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar22 +
                ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        uVar33 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar29 + -1];
        if (uVar33 != ppVar10[-1].first) break;
        uVar17 = lVar22 - 1;
        if (uVar17 < 0x20) {
          ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar9 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar30 = uVar17 >> 5 | 0xf800000000000000;
          if (1 < lVar22) {
            uVar30 = uVar17 >> 5;
          }
          ppVar9 = (_Elt_pointer)
                   ((unsigned_long *)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node +
                   uVar30);
          ppVar14 = (_Elt_pointer)ppVar9->first;
          ppVar10 = ppVar14 + uVar17 + uVar30 * -0x20;
        }
        if (ppVar10 == ppVar14) {
          ppVar10 = (_Elt_pointer)(ppVar9[-1].second + 0x200);
        }
        if (uVar33 != ppVar10[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)local_178 + lVar29);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar29 + -1];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar29 = lVar29 + -1;
    } while (lVar29 != 0);
  }
  local_50.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_98);
  pvVar3 = *(void **)local_160;
  *(pointer *)local_160 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_160 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_160 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  local_178 = (_Elt_pointer)in;
  local_168 = comm;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar17 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)((_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                  (_Elt_pointer)0x0)) * 0x20;
  local_158 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_178;
  if (uVar17 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_178 = ppVar9, ppVar10 < pppVar7; ppVar10 = (_Elt_pointer)&ppVar10->second) {
    operator_delete((pointer)ppVar10->second);
    ppVar9 = local_178;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar6;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_170;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_158;
  if ((pointer)ppVar9->second !=
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->_M_impl).
      super__Vector_impl_data._M_start) {
    uVar30 = 0;
LAB_00136969:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->
            _M_impl).super__Vector_impl_data._M_start[uVar30] < ppVar10[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00136969;
        }
      }
      while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->
            _M_impl).super__Vector_impl_data._M_start[uVar30] != ppVar10[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar30 + uVar8);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)
                    ->_M_impl).super__Vector_impl_data._M_start[uVar30];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 < (ulong)((long)ppVar9->second -
                              (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *
                                      )&ppVar9->first)->_M_impl).super__Vector_impl_data._M_start >>
                             3));
  }
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar30 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar35 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_160,*(undefined8 *)(local_160 + 8));
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar29 = (long)ppVar14 - (long)local_170;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_108 = (pointer)(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar29 = ((long)ppVar9 - (long)ppVar10 >> 4) + (lVar29 >> 4) +
           (((uVar30 >> 3) - 1) + (ulong)bVar35) * 0x20;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_150 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar11 = local_168;
  if (lVar29 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_158 = ppVar9, local_168 = pcVar11, ppVar10 < pppVar7;
      ppVar10 = (_Elt_pointer)&ppVar10->second) {
    operator_delete((pointer)ppVar10->second);
    ppVar9 = local_158;
    pcVar11 = local_168;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar6;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_170;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_150;
  if (lVar29 + uVar17 != *(long *)(local_160 + 8) - *(long *)local_160 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,(unsigned_long *)&local_108,1,pcVar11);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)pcVar11->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_e0);
  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar11->m_size,(value_type_conflict *)&local_e0,
             (allocator_type *)&local_c8);
  comm_00 = local_168;
  iVar20 = pcVar11->m_rank;
  lVar29 = (long)iVar20;
  if (0 < lVar29) {
    puVar25 = *(pointer *)
               ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar29 * 8 + -8);
    lVar22 = *(long *)local_160;
    local_170 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar33 = 0;
    lVar24 = lVar29;
    do {
      uVar15 = uVar33;
      if (((lVar24 < lVar29) && (uVar33 != 0)) &&
         (uVar15 = uVar33 - 1, puVar25 < *(pointer *)(lVar22 + (uVar33 - 1) * 0x10))) {
        uVar15 = uVar33;
      }
      lVar1 = lVar24 + -1;
      uVar30 = uVar33 + 1;
      if (uVar33 + 1 < uVar17) {
        uVar30 = uVar17;
      }
      puVar31 = (ulong *)(uVar33 * 0x10 + *(long *)local_160);
      uVar32 = uVar33 - 1;
      do {
        uVar33 = uVar30 - 1;
        if (uVar32 + (1 - uVar30) == -1) break;
        puVar4 = (pointer)*puVar31;
        uVar33 = uVar32 + 1;
        puVar31 = puVar31 + 2;
        uVar32 = uVar33;
      } while (*(pointer *)
                ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) <= puVar4);
      puVar4 = *(pointer *)
                ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      iVar19 = 0x12;
      if (puVar4 <= puVar25) {
        *(pointer *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (pointer)((uVar33 - uVar15) + 1);
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = uVar15;
        iVar19 = (uint)(*(pointer *)
                         ((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) < local_108)
                 << 4;
        puVar25 = puVar4;
      }
    } while (((iVar19 == 0x12) || (iVar19 == 0)) && (bVar35 = 1 < lVar24, lVar24 = lVar1, bVar35));
  }
  iVar19 = local_168->m_size;
  if ((iVar20 < iVar19 + -1) && (iVar20 + 1 < iVar19)) {
    lVar22 = *(long *)local_160;
    puVar25 = ((pointer *)
              ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + 8))[lVar29];
    lVar29 = lVar29 + 1;
    uVar30 = (*(long *)(local_160 + 8) - lVar22 >> 4) - 1;
    do {
      uVar27 = uVar30;
      if (uVar17 < uVar30) {
        puVar31 = (ulong *)(uVar30 * 0x10 + lVar22);
        uVar26 = uVar30;
        do {
          uVar27 = uVar26;
          if ((pointer)*puVar31 <
              ((pointer *)
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start)[lVar29]) break;
          uVar26 = uVar26 - 1;
          puVar31 = puVar31 + -2;
          uVar27 = uVar17;
        } while (uVar17 < uVar26);
      }
      puVar4 = ((pointer *)
               local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)[lVar29];
      iVar20 = 0x17;
      if (puVar4 <= puVar25) {
        ((pointer *)
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)[lVar29] = (pointer)((uVar30 - uVar27) + 1);
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar29] = uVar27;
        iVar20 = 0;
        puVar25 = puVar4;
        if (((pointer *)
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start)[lVar29] < local_108) {
          iVar20 = 0x15;
        }
      }
    } while (((iVar20 == 0x17) || (iVar20 == 0)) &&
            (lVar29 = lVar29 + 1, uVar30 = uVar27, iVar19 != (int)lVar29));
  }
  mxx::all2all<unsigned_long>(&local_e0,&local_98,local_168);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_e0);
  uVar33 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  local_158 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  sVar18 = (long)local_158 + uVar33;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_100,sVar18,(allocator_type *)&local_120);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_160,&local_98,&local_b0,
             local_100.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e0,&local_c8,comm_00);
  local_170 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_150 = (_Elt_pointer)uVar33;
  local_128 = sVar18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_180,local_e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_e8);
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVar10 < pppVar7; ppVar10 = (_Elt_pointer)&ppVar10->second) {
    operator_delete((pointer)ppVar10->second);
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar6;
  lVar29 = (long)local_178->second -
           (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)
                 ->_M_impl).super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_168;
  if (lVar29 != 0) {
    lVar29 = lVar29 >> 3;
    do {
      ppVar10 = (_Elt_pointer)((uVar8 - 1) + lVar29);
      lVar29 = lVar29 + -1;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar25 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first
                   )->_M_impl).super__Vector_impl_data._M_start;
        bVar35 = false;
        do {
          ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          uVar17 = puVar25[lVar29];
          if (ppVar9[-1].first <= uVar17) {
            if (!bVar35) {
              ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar9 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              if (uVar17 == ppVar9[-1].first) {
                ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar9 = (_Elt_pointer)
                           (((_Elt_pointer)
                            ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node +
                            -0x10))->second + 0x200);
                }
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)
                ->_M_impl).super__Vector_impl_data._M_start[ppVar9[-1].second - uVar8] =
                     (unsigned_long)ppVar10;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar9[-1].second - uVar8] =
               (unsigned_long)ppVar10;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar35 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar35);
      }
      local_120.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
           _M_impl).super__Vector_impl_data._M_start[lVar29];
      local_120.second = (unsigned_long)ppVar10;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_120);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)ppVar10
        ;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar29 != 0);
  }
  ppVar10 = local_170;
  if (local_170 != (_Elt_pointer)0x0) {
    uVar17 = 0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar13 = local_100.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)ppVar10 + ~uVar17;
      uVar33 = local_100.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar10 + ~uVar17].second;
      bVar35 = false;
      do {
        ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (ppVar9[-1].first <= ppVar13->first) {
          if (!bVar35) {
            ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar9 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            if (ppVar13->first == ppVar9[-1].first) {
              ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar9 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar9[-1].second - uVar8] = uVar33;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar9[-1].second - uVar8] = uVar33;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar35 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar35);
      uVar17 = uVar17 + 1;
    } while ((_Elt_pointer)uVar17 != local_170);
  }
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar28 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_178;
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar25 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar16 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar34 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar12 == ppVar34) {
        puVar25[*(long *)(ppVar16[-1].second + 0x1f8) - uVar8] = (unsigned_long)local_110;
        ppVar34 = (_Elt_pointer)ppVar16[-1].second;
        ppVar16 = (_Elt_pointer)&ppVar16[-1].second;
        ppVar12 = ppVar34 + 0x20;
      }
      else {
        puVar25[ppVar12[-1].second - uVar8] = (unsigned_long)local_110;
      }
      ppVar12 = ppVar12 + -1;
      ppVar28 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar12 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_180 = ppVar28, local_178 = ppVar9, ppVar10 < pppVar7;
      ppVar10 = (_Elt_pointer)&ppVar10->second) {
    operator_delete((pointer)ppVar10->second);
    ppVar28 = local_180;
    ppVar9 = local_178;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar23;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar6;
  local_1e0 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->
              _M_impl).super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_180;
  if ((pointer)ppVar9->second != local_1e0) {
    uVar17 = 0;
    do {
      local_180 = (_Elt_pointer)(uVar17 + uVar8);
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar10 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar10[-1].first <= local_1e0[uVar17]) break;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar33 = ((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar33 + 0x1f8) - uVar8] =
                 (unsigned_long)local_180;
            ppVar10 = (_Elt_pointer)(uVar33 + 0x200);
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                 (unsigned_long)local_180;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar33 = ppVar10[-1].first;
          uVar15 = ppVar10[-1].second;
          while( true ) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar10 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar33 != ppVar10[-1].first) break;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar10 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar10[-1].second - uVar8] = uVar15;
          }
          ppVar9 = local_178;
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_120.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->_M_impl
           ).super__Vector_impl_data._M_start[uVar17];
      local_120.second = (unsigned_long)local_180;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_120);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)local_180;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar17 = uVar17 + 1;
      local_1e0 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar9->first)->
                  _M_impl).super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)ppVar9->second - (long)local_1e0 >> 3));
  }
  if ((_Elt_pointer)local_128 != local_170) {
    sVar18 = local_128 - (long)local_170;
    local_78 = ((long)local_150 + (long)local_158) - 1;
    uVar17 = 0;
    local_128 = sVar18;
    do {
      pcVar11 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_168 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_150 = (_Elt_pointer)((long)local_170 + uVar17);
        local_158 = (_Elt_pointer)((long)local_150 * 0x10);
        local_180 = (_Elt_pointer)
                    local_100.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)local_150].second;
        ppVar13 = local_100.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_150;
        local_178 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        do {
          ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar10 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar10[-1].first <= ppVar13->first) break;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar33 = ((_Elt_pointer)
                     ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar33 + 0x1f8) - uVar8] =
                 (unsigned_long)local_180;
            ppVar10 = (_Elt_pointer)(uVar33 + 0x200);
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                 (unsigned_long)local_180;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar33 = ppVar10[-1].first;
          uVar15 = ppVar10[-1].second;
          while( true ) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar10 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar33 != ppVar10[-1].first) break;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar10 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar10[-1].second - uVar8] = uVar15;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
        sVar18 = local_128;
        pcVar11 = local_168;
        ppVar10 = local_178;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (*(unsigned_long *)
               ((long)&(local_100.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + (long)local_158) ==
              ppVar9[-1].first) {
            ppVar9 = local_150;
            if ((uVar17 + 1 < local_128) &&
               (*(long *)((long)&(local_100.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first +
                         (long)local_158) ==
                *(long *)((long)&local_100.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].first +
                         (long)local_158))) {
              ppVar13 = local_100.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_170 + uVar17 + 2;
              do {
                uVar30 = uVar17;
                ppVar9 = (_Elt_pointer)local_78;
                if (local_128 <= uVar30 + 2) goto LAB_00137a55;
                ppVar2 = ppVar13 + -1;
                puVar5 = &ppVar13->first;
                ppVar13 = ppVar13 + 1;
                uVar17 = uVar30 + 1;
              } while (ppVar2->first == *puVar5);
              ppVar9 = (_Elt_pointer)(uVar30 + 1 + (long)local_170);
LAB_00137a55:
              uVar17 = uVar30 + 1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              do {
                ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar14 = (_Elt_pointer)
                            (((_Elt_pointer)
                             ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x200);
                }
                pcVar11 = local_168;
                ppVar10 = local_178;
                if (ppVar14[-1].first !=
                    local_100.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].first) break;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [*(long *)(((_Elt_pointer)
                             ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x1f8) - uVar8] =
                       local_100.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].second;
                  operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                       local_100.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].second;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
                pcVar11 = local_168;
                ppVar10 = local_178;
              } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                       local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
            }
          }
        }
      }
    } while (((comm *)ppVar10 != pcVar11) && (uVar17 = uVar17 + 1, uVar17 < sVar18));
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_178 = (_Elt_pointer)
                (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar25 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_180 = ppVar10;
      ppVar23 = ppVar9;
      ppVar28 = ppVar14;
      while( true ) {
        lVar29 = (long)ppVar23 - (long)ppVar28 >> 4;
        uVar17 = lVar29 - 1;
        if (uVar17 < 0x20) {
          ppVar12 = ppVar23 + -1;
        }
        else {
          uVar30 = uVar17 >> 5 | 0xf800000000000000;
          if (1 < lVar29) {
            uVar30 = uVar17 >> 5;
          }
          ppVar12 = (_Elt_pointer)
                    ((pointer)(&local_180->first)[uVar30] + (uVar17 + uVar30 * -0x20) * 2);
        }
        if (ppVar12 == local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar12 = ppVar9;
        if (ppVar9 == ppVar14) {
          ppVar12 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
        }
        if (uVar17 < 0x20) {
          ppVar34 = ppVar23 + -1;
          ppVar21 = ppVar28;
          ppVar16 = local_180;
        }
        else {
          uVar30 = uVar17 >> 5 | 0xf800000000000000;
          if (1 < lVar29) {
            uVar30 = uVar17 >> 5;
          }
          ppVar16 = (_Elt_pointer)(&local_180->first + uVar30);
          ppVar21 = (_Elt_pointer)ppVar16->first;
          ppVar34 = ppVar21 + uVar17 + uVar30 * -0x20;
        }
        if (ppVar34 == ppVar21) {
          ppVar34 = (_Elt_pointer)(ppVar16[-1].second + 0x200);
        }
        if (ppVar12[-1].first != ppVar34[-1].first) break;
        if (ppVar23 == ppVar28) {
          ppVar28 = (_Elt_pointer)local_180[-1].second;
          local_180 = (_Elt_pointer)&local_180[-1].second;
          ppVar23 = ppVar28 + 0x20;
        }
        ppVar12 = ppVar9;
        if (ppVar9 == ppVar14) {
          ppVar12 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
        }
        ppVar23 = ppVar23 + -1;
        ppVar34 = ppVar23;
        if (ppVar23 == ppVar28) {
          ppVar34 = (_Elt_pointer)(local_180[-1].second + 0x200);
        }
        puVar25[ppVar34[-1].second - uVar8] = ppVar12[-1].second;
      }
      if (ppVar9 == ppVar14) {
        ppVar9 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
      }
      *(pointer *)((long)local_178 + (ppVar9[-1].second - uVar8) * 8) = local_110;
      if (ppVar23 == ppVar28) {
        ppVar28 = (_Elt_pointer)local_180[-1].second;
        local_180 = (_Elt_pointer)&local_180[-1].second;
        ppVar23 = ppVar28 + 0x20;
      }
      ppVar9 = ppVar23 + -1;
      ppVar10 = local_180;
      ppVar14 = ppVar28;
    } while (ppVar9 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_160,&local_100);
  if (local_100.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_100.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1d8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}